

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

List<String> * Process::environment(void)

{
  long *plVar1;
  vector<String,_std::allocator<String>_> *in_RDI;
  long *plVar2;
  String local_40;
  
  plVar1 = _environ;
  (in_RDI->super__Vector_base<String,_std::allocator<String>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<String,_std::allocator<String>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<String,_std::allocator<String>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*plVar1 != 0) {
    do {
      plVar2 = plVar1 + 1;
      String::String(&local_40,(char *)*plVar1,0xffffffffffffffff);
      std::vector<String,_std::allocator<String>_>::emplace_back<String>(in_RDI,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40.mString._M_dataplus._M_p != &local_40.mString.field_2) {
        operator_delete(local_40.mString._M_dataplus._M_p);
      }
      plVar1 = plVar2;
    } while (*plVar2 != 0);
  }
  return (List<String> *)in_RDI;
}

Assistant:

List<String> Process::environment()
{
#ifdef OS_Darwin
    char **cur = *_NSGetEnviron();
#else
    extern char** environ;
    char** cur = environ;
#endif
    List<String> env;
    while (*cur) {
        env.push_back(*cur);
        ++cur;
    }
    return env;
}